

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int Cudd_PrintDebug(DdManager *dd,DdNode *f,int n,int pr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  
  if (f == (DdNode *)0x0) {
    fwrite(": is the NULL DD\n",0x11,1,(FILE *)dd->out);
    uVar4 = 0;
  }
  else {
    if (dd->zero == f) {
      if (pr < 1) {
        return 1;
      }
    }
    else if ((pr < 1) || ((DdNode *)((ulong)dd->one ^ 1) != f)) {
      if (pr < 1) {
        return 1;
      }
      uVar1 = Cudd_DagSize(f);
      uVar2 = Cudd_CountLeaves(f);
      dVar5 = Cudd_CountMinterm(dd,f,n);
      uVar4 = (uint)((uVar2 != 0xffffffff && uVar1 != 0xffffffff) && dVar5 != -1.0);
      fprintf((FILE *)dd->out,": %d nodes %d leaves %g minterms\n",(ulong)uVar1,(ulong)uVar2);
      if ((2 < (uint)pr) && (iVar3 = cuddP(dd,f), iVar3 == 0)) {
        uVar4 = 0;
      }
      if (pr == 2 || 3 < (uint)pr) {
        iVar3 = Cudd_PrintMinterm(dd,f);
        if (iVar3 == 0) {
          uVar4 = 0;
        }
        fputc(10,(FILE *)dd->out);
      }
      goto LAB_006639a8;
    }
    fwrite(": is the zero DD\n",0x11,1,(FILE *)dd->out);
    uVar4 = 1;
  }
LAB_006639a8:
  fflush((FILE *)dd->out);
  return uVar4;
}

Assistant:

int
Cudd_PrintDebug(
  DdManager * dd,
  DdNode * f,
  int  n,
  int  pr)
{
    DdNode *azero, *bzero;
    int    nodes;
    int    leaves;
    double minterms;
    int    retval = 1;

    if (f == NULL) {
        (void) fprintf(dd->out,": is the NULL DD\n");
        (void) fflush(dd->out);
        return(0);
    }
    azero = DD_ZERO(dd);
    bzero = Cudd_Not(DD_ONE(dd));
    if ((f == azero || f == bzero) && pr > 0){
       (void) fprintf(dd->out,": is the zero DD\n");
       (void) fflush(dd->out);
       return(1);
    }
    if (pr > 0) {
        nodes = Cudd_DagSize(f);
        if (nodes == CUDD_OUT_OF_MEM) retval = 0;
        leaves = Cudd_CountLeaves(f);
        if (leaves == CUDD_OUT_OF_MEM) retval = 0;
        minterms = Cudd_CountMinterm(dd, f, n);
        if (minterms == (double)CUDD_OUT_OF_MEM) retval = 0;
        (void) fprintf(dd->out,": %d nodes %d leaves %g minterms\n",
                       nodes, leaves, minterms);
        if (pr > 2) {
            if (!cuddP(dd, f)) retval = 0;
        }
        if (pr == 2 || pr > 3) {
            if (!Cudd_PrintMinterm(dd,f)) retval = 0;
            (void) fprintf(dd->out,"\n");
        }
        (void) fflush(dd->out);
    }
    return(retval);

}